

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O2

int solvePlain(char *filename)

{
  int iVar1;
  HModel model;
  HDual solver;
  
  HModel::HModel(&model);
  iVar1 = HModel::load_fromMPS((char *)&model);
  if (iVar1 == 0) {
    HModel::scaleModel();
    HDual::HDual(&solver);
    HDual::solve((HModel *)&solver,(int)&model,0);
    HModel::util_reportSolverOutcome((char *)&model);
    HModel::util_reportModelDense();
    HDual::~HDual(&solver);
  }
  HModel::~HModel(&model);
  return iVar1;
}

Assistant:

int solvePlain(const char *filename) {
  HModel model;
  //  model.intOption[INTOPT_PRINT_FLAG] = 1;
    int RtCd = model.load_fromMPS(filename);
  //  int RtCd = model.load_fromToy(filename);
  if (RtCd) return RtCd;
  
  model.scaleModel();
  HDual solver;
  solver.solve(&model);
  model.util_reportSolverOutcome("Solve plain");
#ifdef JAJH_dev
  model.util_reportModelDense();
  //Possibly analyse the degeneracy of the primal and dual activities
  //  model.util_anPrDuDgn();
#endif
  //  model.util_reportModel();
  //model.util_reportModelSolution();
  return 0;
}